

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sipc.c
# Opt level: O0

void nn_sipc_term(nn_sipc *self)

{
  nn_sipc *self_local;
  
  if (self->state != 1) {
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)(uint)self->state,
            "NN_SIPC_STATE_IDLE",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/ipc/sipc.c"
            ,0x5b);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_fsm_event_term(&self->done);
  nn_msg_term(&self->outmsg);
  nn_msg_term(&self->inmsg);
  nn_pipebase_term(&self->pipebase);
  nn_streamhdr_term(&self->streamhdr);
  nn_fsm_term(&self->fsm);
  return;
}

Assistant:

void nn_sipc_term (struct nn_sipc *self)
{
    nn_assert_state (self, NN_SIPC_STATE_IDLE);

    nn_fsm_event_term (&self->done);
    nn_msg_term (&self->outmsg);
    nn_msg_term (&self->inmsg);
    nn_pipebase_term (&self->pipebase);
    nn_streamhdr_term (&self->streamhdr);
    nn_fsm_term (&self->fsm);
}